

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

bool ungroup_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object obj;
  Am_Object selection_widget;
  Am_Value_List selected_objs;
  Am_Value is_group;
  Am_Object local_68;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Value local_48;
  Am_Object local_38;
  
  Am_Object::Am_Object(&local_38,self);
  Am_Get_Selection_Widget_For_Command(&local_60);
  Am_Object::~Am_Object(&local_38);
  bVar1 = Am_Object::Valid(&local_60);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_60,0x169,0);
    Am_Value_List::Am_Value_List(&local_58,pAVar2);
    bVar1 = Am_Value_List::Empty(&local_58);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      local_68.data = (Am_Object_Data *)0x0;
      local_48.type = 0;
      local_48.value.wrapper_value = (Am_Wrapper *)0x0;
      Am_Value_List::Start(&local_58);
      while( true ) {
        bVar1 = Am_Value_List::Last(&local_58);
        if (bVar1) break;
        pAVar2 = Am_Value_List::Get(&local_58);
        Am_Object::operator=(&local_68,pAVar2);
        pAVar2 = Am_Object::Get(&local_68,0x1e6,5);
        Am_Value::operator=(&local_48,pAVar2);
        bVar1 = Am_Value::Valid(&local_48);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_0023f67a;
        }
        Am_Value_List::Next(&local_58);
      }
      bVar1 = Am_Check_All_Objects_For_Inactive_Slot(&local_58,self);
LAB_0023f67a:
      Am_Value::~Am_Value(&local_48);
      Am_Object::~Am_Object(&local_68);
    }
    Am_Value_List::~Am_Value_List(&local_58);
  }
  else {
    bVar1 = false;
  }
  Am_Object::~Am_Object(&local_60);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, ungroup_active)
{
  Am_Object selection_widget = Am_Get_Selection_Widget_For_Command(self);
  if (selection_widget.Valid()) {
    Am_Value_List selected_objs = selection_widget.Get(Am_VALUE);
    if (selected_objs.Empty())
      return false;
    Am_Object obj;
    Am_Value is_group;
    for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
      obj = selected_objs.Get();
      is_group = obj.Peek(Am_CREATED_GROUP,
                          Am_NO_DEPENDENCY); //don't need GV since won't change
      if (!is_group.Valid())
        return false;
    }
    return Am_Check_All_Objects_For_Inactive_Slot(selected_objs, self);
  } else
    return false;
}